

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

void Cec_CnfNodeAddToSolver(Cec_ManSat_t *p,Gia_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Vec_Ptr_t *vFrontier_00;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar3;
  int local_38;
  int fUseMuxes;
  int k;
  int i;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pNode;
  Vec_Ptr_t *vFrontier;
  Gia_Obj_t *pObj_local;
  Cec_ManSat_t *p_local;
  
  iVar2 = Cec_ObjSatNum(p,pObj);
  if (iVar2 == 0) {
    iVar2 = Gia_ObjIsCi(pObj);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsAnd(pObj);
      if (iVar2 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                      ,0x141,"void Cec_CnfNodeAddToSolver(Cec_ManSat_t *, Gia_Obj_t *)");
      }
      vFrontier_00 = Vec_PtrAlloc(100);
      Cec_ObjAddToFrontier(p,pObj,vFrontier_00);
      for (fUseMuxes = 0; iVar2 = Vec_PtrSize(vFrontier_00), fUseMuxes < iVar2;
          fUseMuxes = fUseMuxes + 1) {
        pObj_00 = (Gia_Obj_t *)Vec_PtrEntry(vFrontier_00,fUseMuxes);
        iVar2 = Cec_ObjSatNum(p,pObj_00);
        if (iVar2 == 0) {
          __assert_fail("Cec_ObjSatNum(p,pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                        ,0x149,"void Cec_CnfNodeAddToSolver(Cec_ManSat_t *, Gia_Obj_t *)");
        }
        iVar2 = Gia_ObjIsMuxType(pObj_00);
        if (iVar2 == 0) {
          Cec_CollectSuper(pObj_00,1,p->vFanins);
          for (local_38 = 0; iVar2 = Vec_PtrSize(p->vFanins), local_38 < iVar2;
              local_38 = local_38 + 1) {
            pGVar3 = (Gia_Obj_t *)Vec_PtrEntry(p->vFanins,local_38);
            pGVar3 = Gia_Regular(pGVar3);
            Cec_ObjAddToFrontier(p,pGVar3,vFrontier_00);
          }
          Cec_AddClausesSuper(p,pObj_00,p->vFanins);
        }
        else {
          Vec_PtrClear(p->vFanins);
          pVVar1 = p->vFanins;
          pGVar3 = Gia_ObjFanin0(pObj_00);
          pGVar3 = Gia_ObjFanin0(pGVar3);
          Vec_PtrPushUnique(pVVar1,pGVar3);
          pVVar1 = p->vFanins;
          pGVar3 = Gia_ObjFanin1(pObj_00);
          pGVar3 = Gia_ObjFanin0(pGVar3);
          Vec_PtrPushUnique(pVVar1,pGVar3);
          pVVar1 = p->vFanins;
          pGVar3 = Gia_ObjFanin0(pObj_00);
          pGVar3 = Gia_ObjFanin1(pGVar3);
          Vec_PtrPushUnique(pVVar1,pGVar3);
          pVVar1 = p->vFanins;
          pGVar3 = Gia_ObjFanin1(pObj_00);
          pGVar3 = Gia_ObjFanin1(pGVar3);
          Vec_PtrPushUnique(pVVar1,pGVar3);
          for (local_38 = 0; iVar2 = Vec_PtrSize(p->vFanins), local_38 < iVar2;
              local_38 = local_38 + 1) {
            pGVar3 = (Gia_Obj_t *)Vec_PtrEntry(p->vFanins,local_38);
            pGVar3 = Gia_Regular(pGVar3);
            Cec_ObjAddToFrontier(p,pGVar3,vFrontier_00);
          }
          Cec_AddClausesMux(p,pObj_00);
        }
        iVar2 = Vec_PtrSize(p->vFanins);
        if (iVar2 < 2) {
          __assert_fail("Vec_PtrSize(p->vFanins) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                        ,0x15c,"void Cec_CnfNodeAddToSolver(Cec_ManSat_t *, Gia_Obj_t *)");
        }
      }
      Vec_PtrFree(vFrontier_00);
    }
    else {
      Vec_PtrPush(p->vUsedNodes,pObj);
      iVar2 = p->nSatVars;
      p->nSatVars = iVar2 + 1;
      Cec_ObjSetSatNum(p,pObj,iVar2);
      sat_solver_setnvars(p->pSat,p->nSatVars);
    }
  }
  return;
}

Assistant:

void Cec_CnfNodeAddToSolver( Cec_ManSat_t * p, Gia_Obj_t * pObj )
{ 
    Vec_Ptr_t * vFrontier;
    Gia_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    // quit if CNF is ready
    if ( Cec_ObjSatNum(p,pObj) )
        return;
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_PtrPush( p->vUsedNodes, pObj );
        Cec_ObjSetSatNum( p, pObj, p->nSatVars++ );
        sat_solver_setnvars( p->pSat, p->nSatVars );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    Cec_ObjAddToFrontier( p, pObj, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Gia_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Cec_ObjSatNum(p,pNode) );
        if ( fUseMuxes && Gia_ObjIsMuxType(pNode) )
        {
            Vec_PtrClear( p->vFanins );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin0( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin0( Gia_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin1( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin1( Gia_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Gia_Obj_t *, p->vFanins, pFanin, k )
                Cec_ObjAddToFrontier( p, Gia_Regular(pFanin), vFrontier );
            Cec_AddClausesMux( p, pNode );
        }
        else
        {
            Cec_CollectSuper( pNode, fUseMuxes, p->vFanins );
            Vec_PtrForEachEntry( Gia_Obj_t *, p->vFanins, pFanin, k )
                Cec_ObjAddToFrontier( p, Gia_Regular(pFanin), vFrontier );
            Cec_AddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_PtrSize(p->vFanins) > 1 );
    }
    Vec_PtrFree( vFrontier );
}